

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_info.cpp
# Opt level: O2

string * __thiscall
duckdb::GetStorageVersionName_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,idx_t serialization_version)

{
  string *psVar1;
  int iVar2;
  _Alloc_hider _Var3;
  long *plVar4;
  char *pcVar5;
  idx_t i;
  idx_t iVar6;
  allocator local_61;
  string *local_60;
  optional_idx min_idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this < (duckdb *)0x4) {
    pcVar5 = "v1.0.0+";
  }
  else {
    min_idx.index = 0xffffffffffffffff;
    _Var3._M_p = (pointer)0xffffffffffffffff;
    plVar4 = &DAT_027a0608;
    local_60 = __return_storage_ptr__;
    for (iVar6 = 0; iVar6 != 0xe; iVar6 = iVar6 + 1) {
      iVar2 = strcmp((char *)plVar4[-1],"latest");
      if ((iVar2 != 0) && (_Var3._M_p == (pointer)0xffffffffffffffff && (duckdb *)*plVar4 == this))
      {
        optional_idx::optional_idx((optional_idx *)&local_50,iVar6);
        min_idx.index = (idx_t)local_50._M_dataplus._M_p;
        _Var3._M_p = local_50._M_dataplus._M_p;
      }
      plVar4 = plVar4 + 2;
    }
    if (_Var3._M_p != (pointer)0xffffffffffffffff) {
      iVar6 = optional_idx::GetIndex(&min_idx);
      ::std::__cxx11::string::string
                ((string *)&local_50,(&serialization_version_info)[iVar6 * 2],&local_61);
      psVar1 = local_60;
      ::std::operator+(local_60,&local_50,"+");
      ::std::__cxx11::string::~string((string *)&local_50);
      return psVar1;
    }
    pcVar5 = "--UNKNOWN--";
    __return_storage_ptr__ = local_60;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,(allocator *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string GetStorageVersionName(idx_t serialization_version) {
	if (serialization_version < 4) {
		// special handling for lower serialization versions
		return "v1.0.0+";
	}
	optional_idx min_idx;
	for (idx_t i = 0; serialization_version_info[i].version_name; i++) {
		if (strcmp(serialization_version_info[i].version_name, "latest") == 0) {
			continue;
		}
		if (serialization_version_info[i].serialization_version != serialization_version) {
			continue;
		}
		if (!min_idx.IsValid()) {
			min_idx = i;
		}
	}
	if (!min_idx.IsValid()) {
		D_ASSERT(0);
		return "--UNKNOWN--";
	}
	auto min_name = serialization_version_info[min_idx.GetIndex()].version_name;
	return string(min_name) + "+";
}